

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getChannelBitDepth(tcu *this,ChannelType channelType)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  int s;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  IVec4 IVar5;
  
  switch(channelType) {
  case SNORM_INT8:
  case UNORM_INT8:
  case SIGNED_INT8:
  case UNSIGNED_INT8:
    s = 8;
    goto LAB_0096e9a5;
  case SNORM_INT16:
  case UNORM_INT16:
  case SIGNED_INT16:
  case UNSIGNED_INT16:
  case HALF_FLOAT:
    s = 0x10;
    goto LAB_0096e9a5;
  case SNORM_INT32:
  case UNORM_INT32:
  case SIGNED_INT32:
  case UNSIGNED_INT32:
  case FLOAT:
    s = 0x20;
    goto LAB_0096e9a5;
  case UNORM_INT24:
  case UNSIGNED_INT24:
    s = 0x18;
    goto LAB_0096e9a5;
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    uVar1 = 4;
    uVar2 = 4;
    uVar3 = 0;
    uVar4 = 0;
    break;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    uVar1 = 5;
    uVar2 = 6;
    uVar3 = 5;
    uVar4 = 0;
    break;
  case UNORM_SHORT_555:
    uVar1 = 5;
    uVar2 = 5;
    uVar3 = 5;
    uVar4 = 0;
    break;
  case UNORM_SHORT_4444:
  case UNSIGNED_SHORT_4444:
    s = 4;
    goto LAB_0096e9a5;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    uVar1 = 5;
    uVar2 = 5;
    uVar3 = 5;
    uVar4 = 1;
    break;
  case UNORM_SHORT_1555:
    uVar1 = 1;
    uVar2 = 5;
    uVar3 = 5;
    uVar4 = 5;
    break;
  case UNORM_INT_101010:
    uVar1 = 10;
    uVar2 = 10;
    uVar3 = 10;
    uVar4 = 0;
    break;
  case SNORM_INT_1010102_REV:
  case UNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    uVar1 = 10;
    uVar2 = 10;
    uVar3 = 10;
    uVar4 = 2;
    break;
  case UNSIGNED_INT_11F_11F_10F_REV:
    uVar1 = 0xb;
    uVar2 = 0xb;
    uVar3 = 10;
    uVar4 = 0;
    break;
  case UNSIGNED_INT_999_E5_REV:
    uVar1 = 9;
    uVar2 = 9;
    uVar3 = 9;
    uVar4 = 0;
    break;
  case UNSIGNED_INT_16_8_8:
    uVar1 = 0x10;
    uVar2 = 8;
    uVar3 = 0;
    uVar4 = 0;
    break;
  case UNSIGNED_INT_24_8:
  case UNSIGNED_INT_24_8_REV:
    uVar1 = 0x18;
    uVar2 = 8;
    uVar3 = 0;
    uVar4 = 0;
    break;
  case FLOAT64:
    s = 0x40;
    goto LAB_0096e9a5;
  case FLOAT_UNSIGNED_INT_24_8_REV:
    uVar1 = 0x20;
    uVar2 = 8;
    uVar3 = 0;
    uVar4 = 0;
    break;
  default:
    s = 0;
LAB_0096e9a5:
    Vector<int,_4>::Vector((Vector<int,_4> *)this,s);
    in_RDX = extraout_RDX;
    goto LAB_0096e9eb;
  }
  *(undefined4 *)this = uVar1;
  *(undefined4 *)(this + 4) = uVar2;
  *(undefined4 *)(this + 8) = uVar3;
  *(undefined4 *)(this + 0xc) = uVar4;
LAB_0096e9eb:
  IVar5.m_data[2] = (int)in_RDX;
  IVar5.m_data[3] = (int)((ulong)in_RDX >> 0x20);
  IVar5.m_data._0_8_ = this;
  return (IVec4)IVar5.m_data;
}

Assistant:

static IVec4 getChannelBitDepth (TextureFormat::ChannelType channelType)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (channelType)
	{
		case TextureFormat::SNORM_INT8:						return IVec4(8);
		case TextureFormat::SNORM_INT16:					return IVec4(16);
		case TextureFormat::SNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_INT8:						return IVec4(8);
		case TextureFormat::UNORM_INT16:					return IVec4(16);
		case TextureFormat::UNORM_INT24:					return IVec4(24);
		case TextureFormat::UNORM_INT32:					return IVec4(32);
		case TextureFormat::UNORM_BYTE_44:					return IVec4(4,4,0,0);
		case TextureFormat::UNORM_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNORM_SHORT_4444:				return IVec4(4);
		case TextureFormat::UNORM_SHORT_555:				return IVec4(5,5,5,0);
		case TextureFormat::UNORM_SHORT_5551:				return IVec4(5,5,5,1);
		case TextureFormat::UNORM_SHORT_1555:				return IVec4(1,5,5,5);
		case TextureFormat::UNSIGNED_BYTE_44:				return IVec4(4,4,0,0);
		case TextureFormat::UNSIGNED_SHORT_565:				return IVec4(5,6,5,0);
		case TextureFormat::UNSIGNED_SHORT_4444:			return IVec4(4);
		case TextureFormat::UNSIGNED_SHORT_5551:			return IVec4(5,5,5,1);
		case TextureFormat::UNORM_INT_101010:				return IVec4(10,10,10,0);
		case TextureFormat::SNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNORM_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::SIGNED_INT8:					return IVec4(8);
		case TextureFormat::SIGNED_INT16:					return IVec4(16);
		case TextureFormat::SIGNED_INT32:					return IVec4(32);
		case TextureFormat::UNSIGNED_INT8:					return IVec4(8);
		case TextureFormat::UNSIGNED_INT16:					return IVec4(16);
		case TextureFormat::UNSIGNED_INT24:					return IVec4(24);
		case TextureFormat::UNSIGNED_INT32:					return IVec4(32);
		case TextureFormat::SIGNED_INT_1010102_REV:			return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_1010102_REV:		return IVec4(10,10,10,2);
		case TextureFormat::UNSIGNED_INT_16_8_8:			return IVec4(16,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8:				return IVec4(24,8,0,0);
		case TextureFormat::UNSIGNED_INT_24_8_REV:			return IVec4(24,8,0,0);
		case TextureFormat::HALF_FLOAT:						return IVec4(16);
		case TextureFormat::FLOAT:							return IVec4(32);
		case TextureFormat::FLOAT64:						return IVec4(64);
		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:	return IVec4(11,11,10,0);
		case TextureFormat::UNSIGNED_INT_999_E5_REV:		return IVec4(9,9,9,0);
		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:	return IVec4(32,8,0,0);
		default:
			DE_ASSERT(false);
			return IVec4(0);
	}
}